

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseElementDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  elementDeclSAXFunc p_Var5;
  int iVar6;
  xmlChar *pxVar7;
  xmlParserErrors code;
  xmlElementContentPtr cur;
  xmlDocPtr doc;
  xmlElementContentPtr content;
  char *pcVar8;
  xmlElementContentPtr local_30;
  
  local_30 = (xmlElementContentPtr)0x0;
  pxVar3 = ctxt->input;
  pxVar7 = pxVar3->cur;
  if (*pxVar7 != '<') {
    return -1;
  }
  if (pxVar7[1] != '!') {
    return -1;
  }
  pxVar3->cur = pxVar7 + 2;
  pxVar3->col = pxVar3->col + 2;
  if (pxVar7[2] == '\0') {
    xmlParserGrow(ctxt);
  }
  pxVar3 = ctxt->input;
  pxVar7 = pxVar3->cur;
  if (*pxVar7 != 'E') {
    return -1;
  }
  if (pxVar7[1] != 'L') {
    return -1;
  }
  if (pxVar7[2] != 'E') {
    return -1;
  }
  if (pxVar7[3] != 'M') {
    return -1;
  }
  if (pxVar7[4] != 'E') {
    return -1;
  }
  if (pxVar7[5] != 'N') {
    return -1;
  }
  if (pxVar7[6] != 'T') {
    return -1;
  }
  iVar2 = pxVar3->id;
  pxVar3->cur = pxVar7 + 7;
  pxVar3->col = pxVar3->col + 7;
  if (pxVar7[7] == '\0') {
    xmlParserGrow(ctxt);
  }
  iVar6 = xmlSkipBlankCharsPE(ctxt);
  if (iVar6 == 0) {
    pcVar8 = "Space required after \'ELEMENT\'\n";
    code = XML_ERR_SPACE_REQUIRED;
    goto LAB_00139a12;
  }
  pxVar7 = xmlParseName(ctxt);
  if (pxVar7 == (xmlChar *)0x0) {
    pcVar8 = "xmlParseElementDecl: no name for Element\n";
    code = XML_ERR_NAME_REQUIRED;
    goto LAB_00139a12;
  }
  iVar6 = xmlSkipBlankCharsPE(ctxt);
  if (iVar6 == 0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "Space required after the element name\n");
  }
  pxVar3 = ctxt->input;
  pxVar4 = pxVar3->cur;
  xVar1 = *pxVar4;
  if (xVar1 != '(') {
    if (xVar1 == 'A') {
      if ((pxVar4[1] == 'N') && (pxVar4[2] == 'Y')) {
        pxVar3->cur = pxVar4 + 3;
        pxVar3->col = pxVar3->col + 3;
        iVar6 = 2;
        xVar1 = pxVar4[3];
joined_r0x0013983c:
        if (xVar1 == '\0') {
          xmlParserGrow(ctxt);
        }
        goto LAB_00139913;
      }
    }
    else if ((((xVar1 == 'E') && (pxVar4[1] == 'M')) && (pxVar4[2] == 'P')) &&
            ((pxVar4[3] == 'T' && (pxVar4[4] == 'Y')))) {
      pxVar3->cur = pxVar4 + 5;
      pxVar3->col = pxVar3->col + 5;
      iVar6 = 1;
      xVar1 = pxVar4[5];
      goto joined_r0x0013983c;
    }
    pcVar8 = "xmlParseElementDecl: \'EMPTY\', \'ANY\' or \'(\' expected\n";
    code = XML_ERR_ELEMCONTENT_NOT_STARTED;
LAB_00139a12:
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0
               ,(xmlChar *)0x0,0,"%s",pcVar8);
    return -1;
  }
  iVar6 = xmlParseElementContentDecl(ctxt,pxVar7,&local_30);
LAB_00139913:
  xmlSkipBlankCharsPE(ctxt);
  if (*ctxt->input->cur == '>') {
    if (iVar2 != ctxt->input->id) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "Element declaration doesn\'t start and stop in the same entity\n");
    }
    xmlNextChar(ctxt);
    cur = local_30;
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var5 = ctxt->sax->elementDecl, p_Var5 != (elementDeclSAXFunc)0x0)) {
      if (local_30 == (xmlElementContentPtr)0x0) {
        (*p_Var5)(ctxt->userData,pxVar7,iVar6,(xmlElementContentPtr)0x0);
        return iVar6;
      }
      local_30->parent = (_xmlElementContent *)0x0;
      (*p_Var5)(ctxt->userData,pxVar7,iVar6,local_30);
      if (cur->parent != (_xmlElementContent *)0x0) {
        return iVar6;
      }
      doc = ctxt->myDoc;
      goto LAB_00139a4e;
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
  }
  if (local_30 == (xmlElementContentPtr)0x0) {
    return iVar6;
  }
  doc = ctxt->myDoc;
  cur = local_30;
LAB_00139a4e:
  xmlFreeDocElementContent(doc,cur);
  return iVar6;
}

Assistant:

int
xmlParseElementDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    int ret = -1;
    xmlElementContentPtr content  = NULL;

    if ((CUR != '<') || (NXT(1) != '!'))
        return(ret);
    SKIP(2);

    /* GROW; done in the caller */
    if (CMP7(CUR_PTR, 'E', 'L', 'E', 'M', 'E', 'N', 'T')) {
	int inputid = ctxt->input->id;

	SKIP(7);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space required after 'ELEMENT'\n");
	    return(-1);
	}
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "xmlParseElementDecl: no name for Element\n");
	    return(-1);
	}
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after the element name\n");
	}
	if (CMP5(CUR_PTR, 'E', 'M', 'P', 'T', 'Y')) {
	    SKIP(5);
	    /*
	     * Element must always be empty.
	     */
	    ret = XML_ELEMENT_TYPE_EMPTY;
	} else if ((RAW == 'A') && (NXT(1) == 'N') &&
	           (NXT(2) == 'Y')) {
	    SKIP(3);
	    /*
	     * Element is a generic container.
	     */
	    ret = XML_ELEMENT_TYPE_ANY;
	} else if (RAW == '(') {
	    ret = xmlParseElementContentDecl(ctxt, name, &content);
	} else {
	    /*
	     * [ WFC: PEs in Internal Subset ] error handling.
	     */
            xmlFatalErrMsg(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED,
                  "xmlParseElementDecl: 'EMPTY', 'ANY' or '(' expected\n");
	    return(-1);
	}

	SKIP_BLANKS_PE;

	if (RAW != '>') {
	    xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
	    if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	} else {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element declaration doesn't start and stop in"
                               " the same entity\n");
	    }

	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->elementDecl != NULL)) {
		if (content != NULL)
		    content->parent = NULL;
	        ctxt->sax->elementDecl(ctxt->userData, name, ret,
		                       content);
		if ((content != NULL) && (content->parent == NULL)) {
		    /*
		     * this is a trick: if xmlAddElementDecl is called,
		     * instead of copying the full tree it is plugged directly
		     * if called from the parser. Avoid duplicating the
		     * interfaces or change the API/ABI
		     */
		    xmlFreeDocElementContent(ctxt->myDoc, content);
		}
	    } else if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	}
    }
    return(ret);
}